

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cpp
# Opt level: O3

void __thiscall NotNode::NotNode(NotNode *this,ExpNode *exp)

{
  (this->super_ExpNode).super_StmtNode.super_ASTNode._vptr_ASTNode =
       (_func_int **)&PTR__NotNode_00124c18;
  this->exp = exp;
  (this->super_ExpNode).lValue = false;
  (this->super_ExpNode).pointer = false;
  (this->super_ExpNode).type = -0x2a;
  (this->super_ExpNode).arraySize = -0x2a;
  (this->super_ExpNode).typeLexeme = "NotDefined";
  (this->super_ExpNode).super_StmtNode.super_ASTNode.line = -0x2a;
  (this->super_ExpNode).lexeme = "NotDefined";
  return;
}

Assistant:

NotNode::NotNode(ExpNode *exp) {
    this->exp = exp;

    this->setLValue(false);
    this->setPointer(false);
    this->setType(-42);
    this->setTypeLexeme("NotDefined");
    this->setLine(-42);
    this->setArraySize(-42);
    this->setLexeme("NotDefined");
}